

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::SparseNode::ByteSizeLong(SparseNode *this)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int __c;
  int __c_00;
  char *in_RSI;
  double dVar4;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  SparseNode *this_local;
  
  sStack_18 = 0;
  dVar4 = value(this);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    sStack_18 = 9;
  }
  pcVar2 = index(this,in_RSI,__c);
  if ((int)pcVar2 != 0) {
    pcVar2 = index(this,in_RSI,__c_00);
    sVar3 = google::protobuf::internal::WireFormatLite::Int32Size((int32)pcVar2);
    sStack_18 = sVar3 + 1 + sStack_18;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t SparseNode::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SparseNode)
  size_t total_size = 0;

  // double value = 2;
  if (this->value() != 0) {
    total_size += 1 + 8;
  }

  // int32 index = 1;
  if (this->index() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->index());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}